

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::HttpMethod> __thiscall kj::consumeHttpMethod(kj *this,char **ptr)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  NullableValue<kj::HttpMethod> NVar4;
  NullableValue<kj::HttpMethod> NVar5;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_00;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_01;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_02;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_03;
  NullableValue<kj::HttpMethod> NVar6;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_04;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_05;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_06;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_07;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_08;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_09;
  anon_union_4_1_a8c68091_for_NullableValue<kj::HttpMethod>_2 extraout_var_10;
  
  pbVar3 = (byte *)*ptr;
  NVar4._0_4_ = *pbVar3 - 0x41;
  NVar4.field_1.value = GET;
  NVar5 = NVar4;
  if (NVar4._0_4_ < 0x15) {
    pbVar1 = pbVar3 + 1;
    NVar5 = (NullableValue<kj::HttpMethod>)
            ((long)&switchD_002b339a::switchdataD_00394af0 +
            (long)(int)(&switchD_002b339a::switchdataD_00394af0)[(long)NVar4]);
    switch(NVar4) {
    case (NullableValue<kj::HttpMethod>)0x0:
      if ((*pbVar1 == 0x43) && (pbVar3[2] == 0x4c)) {
        *ptr = (char *)(pbVar3 + 3);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x11;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x2:
      bVar2 = pbVar3[1];
      NVar5._1_7_ = 0;
      NVar5.isSet = (bool)bVar2;
      if (bVar2 == 0x4f) {
        if ((pbVar3[2] == 0x50) && (pbVar3[3] == 0x59)) {
          *ptr = (char *)(pbVar3 + 4);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 9;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      else if (bVar2 == 0x48) {
        NVar5._0_4_ = strncmp((char *)(pbVar3 + 2),"ECKOUT",6);
        NVar5.field_1.value = extraout_var_03.value;
        if (NVar5._0_4_ == 0) {
          *ptr = (char *)(pbVar3 + 8);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0x14;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x3:
      NVar5._0_4_ = strncmp((char *)pbVar1,"ELETE",5);
      NVar5.field_1.value = extraout_var_02.value;
      if (NVar5._0_4_ == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 4;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x6:
      if ((*pbVar1 == 0x45) && (pbVar3[2] == 0x54)) {
        *ptr = (char *)(pbVar3 + 3);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x7:
      if (((*pbVar1 == 0x45) && (pbVar3[2] == 0x41)) && (pbVar3[3] == 0x44)) {
        *ptr = (char *)(pbVar3 + 4);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 1;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0xb:
      if (((*pbVar1 == 0x4f) && (pbVar3[2] == 0x43)) && (pbVar3[3] == 0x4b)) {
        *ptr = (char *)(pbVar3 + 4);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 10;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0xc:
      NVar6._0_4_ = (int)(char)pbVar3[1] - 0x45U >> 1 |
                    (uint)(((int)(char)pbVar3[1] - 0x45U & 1) != 0) << 0x1f;
      NVar6.field_1.value = GET;
      NVar5 = NVar6;
      if (NVar6._0_4_ < 8) {
        pbVar1 = pbVar3 + 2;
        NVar5 = (NullableValue<kj::HttpMethod>)
                ((long)&switchD_002b35f9::switchdataD_00394b44 +
                (long)(int)(&switchD_002b35f9::switchdataD_00394b44)[(long)NVar6]);
        switch(NVar6) {
        case (NullableValue<kj::HttpMethod>)0x0:
          if (((*pbVar1 == 0x52) && (pbVar3[3] == 0x47)) && (pbVar3[4] == 0x45)) {
            *ptr = (char *)(pbVar3 + 5);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x15;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
          break;
        case (NullableValue<kj::HttpMethod>)0x3:
          bVar2 = pbVar3[2];
          NVar5._1_7_ = 0;
          NVar5.isSet = (bool)bVar2;
          if (bVar2 == 0x43) {
            if ((pbVar3[3] == 0x4f) && (pbVar3[4] == 0x4c)) {
              *ptr = (char *)(pbVar3 + 5);
              *this = (kj)0x1;
              *(undefined4 *)(this + 4) = 0xb;
              return (Maybe<kj::HttpMethod>)NVar5;
            }
          }
          else if (bVar2 == 0x41) {
            NVar5._0_4_ = strncmp((char *)(pbVar3 + 3),"CTIVITY",7);
            NVar5.field_1.value = extraout_var_07.value;
            if (NVar5._0_4_ == 0) {
              *ptr = (char *)(pbVar3 + 10);
              *this = (kj)0x1;
              *(undefined4 *)(this + 4) = 0x13;
              return (Maybe<kj::HttpMethod>)NVar5;
            }
          }
          break;
        case (NullableValue<kj::HttpMethod>)0x5:
          if ((*pbVar1 == 0x56) && (pbVar3[3] == 0x45)) {
            *ptr = (char *)(pbVar3 + 4);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0xc;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
          break;
        case (NullableValue<kj::HttpMethod>)0x7:
          NVar5._0_4_ = strncmp((char *)pbVar1,"EARCH",5);
          NVar5.field_1.value = extraout_var_08.value;
          if (NVar5._0_4_ == 0) {
            *ptr = (char *)(pbVar3 + 7);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x16;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
        }
      }
      break;
    case (NullableValue<kj::HttpMethod>)0xd:
      NVar5._0_4_ = strncmp((char *)pbVar1,"OTIFY",5);
      NVar5.field_1.value = extraout_var_04.value;
      if (NVar5._0_4_ == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x17;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0xe:
      NVar5._0_4_ = strncmp((char *)pbVar1,"PTIONS",6);
      NVar5.field_1.value = extraout_var_05.value;
      if (NVar5._0_4_ == 0) {
        *ptr = (char *)(pbVar3 + 7);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 7;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0xf:
      bVar2 = pbVar3[1];
      NVar5._1_7_ = 0;
      NVar5.isSet = (bool)bVar2;
      if (bVar2 < 0x52) {
        if (bVar2 == 0x41) {
          if (((pbVar3[2] == 0x54) && (pbVar3[3] == 0x43)) && (pbVar3[4] == 0x48)) {
            *ptr = (char *)(pbVar3 + 5);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 5;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
        }
        else if (((bVar2 == 0x4f) && (pbVar3[2] == 0x53)) && (pbVar3[3] == 0x54)) {
          *ptr = (char *)(pbVar3 + 4);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 2;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      else if (bVar2 == 0x52) {
        if ((pbVar3[2] == 0x4f) && (pbVar3[3] == 0x50)) {
          bVar2 = pbVar3[4];
          NVar5._1_7_ = 0;
          NVar5.isSet = (bool)bVar2;
          if (bVar2 == 0x50) {
            NVar5._0_4_ = strncmp((char *)(pbVar3 + 5),"ATCH",4);
            NVar5.field_1.value = extraout_var_10.value;
            if (NVar5._0_4_ == 0) {
              *ptr = (char *)(pbVar3 + 9);
              *this = (kj)0x1;
              *(undefined4 *)(this + 4) = 0xe;
              return (Maybe<kj::HttpMethod>)NVar5;
            }
          }
          else if (((bVar2 == 0x46) && (pbVar3[5] == 0x49)) &&
                  ((pbVar3[6] == 0x4e && (pbVar3[7] == 0x44)))) {
            *ptr = (char *)(pbVar3 + 8);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0xd;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
        }
      }
      else if (bVar2 == 0x55) {
        NVar5 = (NullableValue<kj::HttpMethod>)((long)pbVar3 + 3);
        if (pbVar3[2] == 0x54) {
          *ptr = (char *)NVar5;
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 3;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
        if (((pbVar3[2] == 0x52) && (*(byte *)NVar5 == 0x47)) && (pbVar3[4] == 0x45)) {
          *ptr = (char *)(pbVar3 + 5);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 6;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x11:
      NVar5._0_4_ = strncmp((char *)pbVar1,"EPORT",5);
      NVar5.field_1.value = extraout_var.value;
      if (NVar5._0_4_ == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x12;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x12:
      bVar2 = pbVar3[1];
      NVar5._1_7_ = 0;
      NVar5.isSet = (bool)bVar2;
      if (bVar2 == 0x55) {
        NVar5._0_4_ = strncmp((char *)(pbVar3 + 2),"BSCRIBE",7);
        NVar5.field_1.value = extraout_var_06.value;
        if (NVar5._0_4_ == 0) {
          *ptr = (char *)(pbVar3 + 9);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0x18;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      else if (bVar2 == 0x45) {
        NVar5._0_4_ = strncmp((char *)(pbVar3 + 2),"ARCH",4);
        NVar5.field_1.value = extraout_var_01.value;
        if (NVar5._0_4_ == 0) {
          *ptr = (char *)(pbVar3 + 6);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0xf;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x13:
      NVar5._0_4_ = strncmp((char *)pbVar1,"RACE",4);
      NVar5.field_1.value = extraout_var_00.value;
      if (NVar5._0_4_ == 0) {
        *ptr = (char *)(pbVar3 + 5);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 8;
        return (Maybe<kj::HttpMethod>)NVar5;
      }
      break;
    case (NullableValue<kj::HttpMethod>)0x14:
      if (*pbVar1 == 0x4e) {
        bVar2 = pbVar3[2];
        NVar5._1_7_ = 0;
        NVar5.isSet = (bool)bVar2;
        if (bVar2 == 0x53) {
          NVar5._0_4_ = strncmp((char *)(pbVar3 + 3),"UBSCRIBE",8);
          NVar5.field_1.value = extraout_var_09.value;
          if (NVar5._0_4_ == 0) {
            *ptr = (char *)(pbVar3 + 0xb);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x19;
            return (Maybe<kj::HttpMethod>)NVar5;
          }
        }
        else if ((((bVar2 == 0x4c) && (pbVar3[3] == 0x4f)) && (pbVar3[4] == 0x43)) &&
                (pbVar3[5] == 0x4b)) {
          *ptr = (char *)(pbVar3 + 6);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0x10;
          return (Maybe<kj::HttpMethod>)NVar5;
        }
      }
    }
  }
  *this = (kj)0x0;
  return (Maybe<kj::HttpMethod>)NVar5;
}

Assistant:

static kj::Maybe<HttpMethod> consumeHttpMethod(char*& ptr) {
  char* p = ptr;

#define EXPECT_REST(prefix, suffix) \
  if (strncmp(p, #suffix, sizeof(#suffix)-1) == 0) { \
    ptr = p + (sizeof(#suffix)-1); \
    return HttpMethod::prefix##suffix; \
  } else { \
    return nullptr; \
  }

  switch (*p++) {
    case 'A': EXPECT_REST(A,CL)
    case 'C':
      switch (*p++) {
        case 'H': EXPECT_REST(CH,ECKOUT)
        case 'O': EXPECT_REST(CO,PY)
        default: return nullptr;
      }
    case 'D': EXPECT_REST(D,ELETE)
    case 'G': EXPECT_REST(G,ET)
    case 'H': EXPECT_REST(H,EAD)
    case 'L': EXPECT_REST(L,OCK)
    case 'M':
      switch (*p++) {
        case 'E': EXPECT_REST(ME,RGE)
        case 'K':
          switch (*p++) {
            case 'A': EXPECT_REST(MKA,CTIVITY)
            case 'C': EXPECT_REST(MKC,OL)
            default: return nullptr;
          }
        case 'O': EXPECT_REST(MO,VE)
        case 'S': EXPECT_REST(MS,EARCH)
        default: return nullptr;
      }
    case 'N': EXPECT_REST(N,OTIFY)
    case 'O': EXPECT_REST(O,PTIONS)
    case 'P':
      switch (*p++) {
        case 'A': EXPECT_REST(PA,TCH)
        case 'O': EXPECT_REST(PO,ST)
        case 'R':
          if (*p++ != 'O' || *p++ != 'P') return nullptr;
          switch (*p++) {
            case 'F': EXPECT_REST(PROPF,IND)
            case 'P': EXPECT_REST(PROPP,ATCH)
            default: return nullptr;
          }
        case 'U':
          switch (*p++) {
            case 'R': EXPECT_REST(PUR,GE)
            case 'T': EXPECT_REST(PUT,)
            default: return nullptr;
          }
        default: return nullptr;
      }
    case 'R': EXPECT_REST(R,EPORT)
    case 'S':
      switch (*p++) {
        case 'E': EXPECT_REST(SE,ARCH)
        case 'U': EXPECT_REST(SU,BSCRIBE)
        default: return nullptr;
      }
    case 'T': EXPECT_REST(T,RACE)
    case 'U':
      if (*p++ != 'N') return nullptr;
      switch (*p++) {
        case 'L': EXPECT_REST(UNL,OCK)
        case 'S': EXPECT_REST(UNS,UBSCRIBE)
        default: return nullptr;
      }
    default: return nullptr;
  }
#undef EXPECT_REST
}